

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

void rloc_to(monst *mtmp,level *lev,int x,int y)

{
  char ox;
  char oy;
  char cVar1;
  int iVar2;
  bool bVar3;
  
  ox = mtmp->mx;
  oy = mtmp->my;
  bVar3 = true;
  cVar1 = ox;
  if ((mtmp->field_0x63 & 2) != 0) {
    iVar2 = inhishop(mtmp);
    bVar3 = iVar2 == 0;
    cVar1 = mtmp->mx;
  }
  if ((cVar1 != x) || (mtmp->my != y)) {
    if (ox != '\0') {
      if (mtmp->wormno == '\0') {
        remove_monster(lev,(int)ox,(int)oy);
        newsym((int)ox,(int)oy);
      }
      else {
        remove_worm(mtmp);
      }
    }
    place_monster(mtmp,x,y);
    update_monster_region(mtmp);
    if (mtmp->wormno != '\0') {
      place_worm_tail_randomly(mtmp,(xchar)x,(xchar)y);
    }
    if (u.ustuck == mtmp) {
      if ((u._1052_1_ & 1) == 0) {
        u.ustuck = (monst *)0x0;
        u._1052_1_ = u._1052_1_ & 0x7e;
      }
      else {
        u.ux = (xchar)x;
        u.uy = (xchar)y;
        doredraw();
      }
    }
    newsym(x,y);
    set_apparxy(lev,mtmp);
    if (!bVar3) {
      iVar2 = inhishop(mtmp);
      if (iVar2 == 0) {
        make_angry_shk(mtmp,ox,oy);
        return;
      }
    }
  }
  return;
}

Assistant:

void rloc_to(struct monst *mtmp, struct level *lev, int x, int y)
{
	int oldx = mtmp->mx, oldy = mtmp->my;
	boolean resident_shk = mtmp->isshk && inhishop(mtmp);

	if (x == mtmp->mx && y == mtmp->my)	/* that was easy */
		return;

	if (oldx) {				/* "pick up" monster */
	    if (mtmp->wormno)
		remove_worm(mtmp);
	    else {
		remove_monster(lev, oldx, oldy);
		newsym(oldx, oldy);		/* update old location */
	    }
	}

	place_monster(mtmp, x, y);		/* put monster down */
	update_monster_region(mtmp);

	if (mtmp->wormno)			/* now put down tail */
		place_worm_tail_randomly(mtmp, x, y);

	if (u.ustuck == mtmp) {
		if (u.uswallow) {
			u.ux = x;
			u.uy = y;
			doredraw();
		} else {
			u.ustuck = 0;
			u.uwilldrown = 0;
		}
	}

	newsym(x, y);				/* update new location */
	set_apparxy(lev, mtmp);			/* orient monster */

	/* shopkeepers will only teleport if you zap them with a wand of
	   teleportation or if they've been transformed into a jumpy monster;
	   the latter only happens if you've attacked them with polymorph */
	if (resident_shk && !inhishop(mtmp)) make_angry_shk(mtmp, oldx, oldy);
}